

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O3

bool __thiscall
QHttpHeaders::replace(QHttpHeaders *this,qsizetype i,QAnyStringView name,QAnyStringView newValue)

{
  QHttpHeadersPrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 local_71;
  Header local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isValidHttpHeaderNameField(name);
  if (bVar2) {
    bVar2 = isValidHttpHeaderValueField(newValue);
    if (bVar2) {
      QExplicitlySharedDataPointer<QHttpHeadersPrivate>::detach(&this->d);
      pQVar1 = (this->d).d.ptr;
      HeaderName::HeaderName(&local_70.name,name);
      normalizedValue(&local_70.value,newValue);
      QList<Header>::replace(&pQVar1->headers,i,&local_70);
      if (&(local_70.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_70.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_70.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_70.value.d.d)->super_QArrayData,1,0x10);
        }
      }
      if ((long)(char)local_70.name.data.
                      super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                      super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                      super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                      super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                      super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                      super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                      _M_index != -1) {
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
          ::_S_vtable._M_arr
          [(char)local_70.name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                 super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                 super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                 super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                 super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                 super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index].
          _M_data)(&local_71,(variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)&local_70);
      }
      bVar2 = true;
      goto LAB_0018ddd1;
    }
  }
  bVar2 = false;
LAB_0018ddd1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpHeaders::replace(qsizetype i, QAnyStringView name, QAnyStringView newValue)
{
    verify(i);
    if (!isValidHttpHeaderNameField(name) || !isValidHttpHeaderValueField(newValue))
        return false;

    d.detach();
    d->headers.replace(i, {HeaderName{name}, normalizedValue(newValue)});
    return true;
}